

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::copyMaterials(OpenGEXImporter *this,aiScene *pScene)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  aiMaterial **ppaVar5;
  iterator __first;
  iterator __last;
  aiScene *pScene_local;
  OpenGEXImporter *this_local;
  
  if (pScene == (aiScene *)0x0) {
    __assert_fail("nullptr != pScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                  ,0x4a6,"void Assimp::OpenGEX::OpenGEXImporter::copyMaterials(aiScene *)");
  }
  bVar2 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::empty(&this->m_materialCache);
  if (!bVar2) {
    sVar3 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size(&this->m_materialCache);
    pScene->mNumMaterials = (uint)sVar3;
    auVar1 = ZEXT416(pScene->mNumMaterials) * ZEXT816(8);
    uVar4 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    ppaVar5 = (aiMaterial **)operator_new__(uVar4);
    pScene->mMaterials = ppaVar5;
    __first = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::begin
                        (&this->m_materialCache);
    __last = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::end(&this->m_materialCache);
    std::
    copy<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>,aiMaterial**>
              ((__normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
                )__first._M_current,
               (__normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
                )__last._M_current,pScene->mMaterials);
  }
  return;
}

Assistant:

void OpenGEXImporter::copyMaterials( aiScene *pScene ) {
    ai_assert( nullptr != pScene );

    if ( m_materialCache.empty() ) {
        return;
    }

    pScene->mNumMaterials = static_cast<unsigned int>(m_materialCache.size());
    pScene->mMaterials = new aiMaterial*[ pScene->mNumMaterials ];
    std::copy( m_materialCache.begin(), m_materialCache.end(), pScene->mMaterials );
}